

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opnd.cpp
# Opt level: O0

IntConstOpnd * IR::IntConstOpnd::New(IntConstType value,IRType type,Func *func,bool dontEncode)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  JitArenaAllocator *pJVar4;
  IntConstOpnd *this;
  TrackAllocData local_58;
  IntConstOpnd *local_30;
  IntConstOpnd *intConstOpnd;
  Func *pFStack_20;
  bool dontEncode_local;
  Func *func_local;
  IntConstType IStack_10;
  IRType type_local;
  IntConstType value_local;
  
  intConstOpnd._7_1_ = dontEncode;
  pFStack_20 = func;
  func_local._7_1_ = type;
  IStack_10 = value;
  if (8 < (uint)TySize[type]) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.cpp"
                       ,0x59b,"(TySize[type] <= sizeof(IntConstType))",
                       "TySize[type] <= sizeof(IntConstType)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  pJVar4 = pFStack_20->m_alloc;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_58,(type_info *)&typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.cpp"
             ,0x59d);
  pJVar4 = (JitArenaAllocator *)
           Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
           TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                          pJVar4,&local_58);
  this = (IntConstOpnd *)new<Memory::JitArenaAllocator>(0x30,pJVar4,0x4e98c0);
  memset(this,0,0x30);
  IntConstOpnd(this);
  (this->super_Opnd).m_type = func_local._7_1_;
  (this->super_Opnd).m_kind = OpndKindIntConst;
  this->m_dontEncode = (bool)(intConstOpnd._7_1_ & 1);
  local_30 = this;
  SetValue(this,IStack_10);
  return local_30;
}

Assistant:

IntConstOpnd *
IntConstOpnd::New(IntConstType value, IRType type, Func *func, bool dontEncode)
{
    IntConstOpnd * intConstOpnd;

    Assert(TySize[type] <= sizeof(IntConstType));

    intConstOpnd = JitAnew(func->m_alloc, IR::IntConstOpnd);

    intConstOpnd->m_type = type;
    intConstOpnd->m_kind = OpndKindIntConst;
    intConstOpnd->m_dontEncode = dontEncode;
    intConstOpnd->SetValue(value);

    return intConstOpnd;
}